

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HarmonicInversionType.hpp
# Opt level: O2

ostream * OpenMD::operator<<(ostream *os,HarmonicInversionType *hit)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"This HarmonicInversionType has below form:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<double>(hit->d0_);
  std::operator<<(poVar1,"*(phi - ");
  poVar1 = std::ostream::_M_insert<double>(hit->phi0_);
  poVar1 = std::operator<<(poVar1,")/2");
  std::endl<char,std::char_traits<char>>(poVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, HarmonicInversionType& hit) {
    os << "This HarmonicInversionType has below form:" << std::endl;
    os << hit.d0_ << "*(phi - " << hit.phi0_ << ")/2" << std::endl;
    return os;
  }